

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O0

bool __thiscall
Market::match(Market *this,queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *orders)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  pointer ppVar5;
  Order *bid_00;
  Order *ask_00;
  double dVar6;
  double dVar7;
  Order *ask;
  Order *bid;
  iterator iAsk;
  iterator iBid;
  queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *orders_local;
  Market *this_local;
  
  while ((sVar2 = std::
                  multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
                  ::size(&this->m_bidOrders), sVar2 != 0 &&
         (sVar3 = std::
                  multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
                  ::size(&this->m_askOrders), sVar3 != 0))) {
    iAsk._M_node = (_Base_ptr)
                   std::
                   multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
                   ::begin(&this->m_bidOrders);
    bid = (Order *)std::
                   multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
                   ::begin(&this->m_askOrders);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&iAsk);
    dVar6 = Order::getPrice(&ppVar5->second);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_double,_Order>_> *)&bid);
    dVar7 = Order::getPrice(&ppVar5->second);
    if (dVar6 < dVar7) {
      sVar4 = std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::size(orders);
      goto LAB_0018a707;
    }
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&iAsk);
    bid_00 = &ppVar5->second;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_double,_Order>_> *)&bid);
    ask_00 = &ppVar5->second;
    match(this,bid_00,ask_00);
    std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::push(orders,bid_00);
    std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::push(orders,ask_00);
    bVar1 = Order::isClosed(bid_00);
    if (bVar1) {
      std::multimap<double,Order,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
      ::erase_abi_cxx11_((multimap<double,Order,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
                          *)&this->m_bidOrders,(iterator)iAsk._M_node);
    }
    bVar1 = Order::isClosed(ask_00);
    if (bVar1) {
      std::multimap<double,Order,std::less<double>,std::allocator<std::pair<double_const,Order>>>::
      erase_abi_cxx11_((multimap<double,Order,std::less<double>,std::allocator<std::pair<double_const,Order>>>
                        *)&this->m_askOrders,(iterator)bid);
    }
  }
  sVar4 = std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::size(orders);
LAB_0018a707:
  this_local._7_1_ = sVar4 != 0;
  return this_local._7_1_;
}

Assistant:

bool Market::match( std::queue < Order > & orders )
{
  while ( true )
  {
    if ( !m_bidOrders.size() || !m_askOrders.size() )
      return orders.size() != 0;

    BidOrders::iterator iBid = m_bidOrders.begin();
    AskOrders::iterator iAsk = m_askOrders.begin();

    if ( iBid->second.getPrice() >= iAsk->second.getPrice() )
    {
      Order & bid = iBid->second;
      Order& ask = iAsk->second;

      match( bid, ask );
      orders.push( bid );
      orders.push( ask );

      if ( bid.isClosed() ) m_bidOrders.erase( iBid );
      if ( ask.isClosed() ) m_askOrders.erase( iAsk );
    }
    else
      return orders.size() != 0;
  }
}